

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

optional<QByteArrayView> * __thiscall
QHttpHeadersPrivate::findValue
          (optional<QByteArrayView> *__return_storage_ptr__,QHttpHeadersPrivate *this,
          HeaderName *name)

{
  char *pcVar1;
  long lVar2;
  Header *pHVar3;
  long in_FS_OFFSET;
  bool bVar4;
  anon_class_16_2_9763bfdf local_50;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->headers).d.size;
  bVar4 = lVar2 == 0;
  if (!bVar4) {
    pHVar3 = (this->headers).d.ptr;
    local_39 = true;
    local_50.__ret = &local_39;
    local_50.__lhs = (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar3;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
      ::_S_vtable._M_arr
      [(long)(char)*(__index_type *)
                    ((long)&(name->data).
                            super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                    + 0x18) + 1]._M_data)(&local_50,&name->data);
    if (local_39 == false) {
      lVar2 = lVar2 * 0x38;
      do {
        lVar2 = lVar2 + -0x38;
        bVar4 = lVar2 == 0;
        if (bVar4) goto LAB_0018dc1c;
        pHVar3 = pHVar3 + 1;
        local_39 = true;
        local_50.__ret = &local_39;
        local_50.__lhs = (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar3;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
          ::_S_vtable._M_arr
          [(long)(char)*(__index_type *)
                        ((long)&(name->data).
                                super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                        + 0x18) + 1]._M_data)(&local_50,&name->data);
      } while (local_39 != true);
    }
    pcVar1 = (pHVar3->value).d.ptr;
    (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size = (pHVar3->value).d.size
    ;
    (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_data = pcVar1;
    (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_engaged = true;
    if (!bVar4) goto LAB_0018dc24;
  }
LAB_0018dc1c:
  (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
  super__Optional_payload_base<QByteArrayView>._M_engaged = false;
LAB_0018dc24:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

const noexcept
{
    for (const auto &h : headers) {
        if (h.name == name)
            return h.value;
    }
    return std::nullopt;
}